

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int is_octal(char *p,size_t len)

{
  size_t local_20;
  size_t len_local;
  char *p_local;
  
  local_20 = len;
  len_local = (size_t)p;
  while( true ) {
    if (local_20 == 0) {
      return 1;
    }
    if ((*(char *)len_local < '0') || ('7' < *(char *)len_local)) break;
    len_local = len_local + 1;
    local_20 = local_20 - 1;
  }
  return 0;
}

Assistant:

static int
is_octal(const char *p, size_t len)
{
	while (len-- > 0) {
		if (*p < '0' || *p > '7')
			return (0);
	        ++p;
	}
	return (1);
}